

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O0

void __thiscall Gecko::Subgraph::Subgraph(Subgraph *this,Graph *g,uint n)

{
  undefined1 auVar1 [16];
  out_of_range *this_00;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  Float in_stack_ffffffffffffff68;
  Float in_stack_ffffffffffffff6c;
  WeightedSum *in_stack_ffffffffffffff70;
  void *local_80;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  
  *in_RDI = in_RSI;
  *(uint *)(in_RDI + 1) = in_EDX;
  in_RDI[2] = *in_RSI;
  local_14 = in_EDX;
  WeightedSum::WeightedSum
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  if (0x10 < local_14) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"optimization window too large",&local_39);
    std::out_of_range::out_of_range(this_00,local_38);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uVar2 = CONCAT44(0,local_14 << ((byte)local_14 & 0x1f));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  if (uVar2 != 0) {
    local_80 = pvVar4;
    do {
      Subnode::Subnode((Subnode *)0x137630);
      local_80 = (void *)((long)local_80 + 0xc);
    } while (local_80 != (void *)((long)pvVar4 + uVar2 * 0xc));
  }
  in_RDI[0x18] = pvVar4;
  return;
}

Assistant:

Subgraph::Subgraph(Graph* g, uint n) : g(g), n(n), f(g->functional)
{
  if (n > GECKO_WINDOW_MAX)
    throw std::out_of_range("optimization window too large");
  cache = new Subnode[n << n];
}